

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve_op.hpp
# Opt level: O2

void asio::detail::
     resolve_op<asio::ip::tcp,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]mau/MauProxy.cpp:532:13)>
     ::do_complete(void *owner,operation *base,error_code *param_3,size_t param_4)

{
  basic_resolver_results<asio::ip::tcp> *this;
  ostringstream *poVar1;
  addrinfo_type *address_info;
  pointer pbVar2;
  anon_class_8_1_8991fb9c aVar3;
  undefined1 host [8];
  bool bVar4;
  undefined4 uVar5;
  OutputWorker *pOVar6;
  ushort uVar7;
  address addr;
  const_iterator __begin1;
  UDPAddress serverAddress;
  ptr local_220;
  const_iterator __end1;
  binder2<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]mau_MauProxy_cpp:532:13),_std::error_code,_asio::ip::basic_resolver_results<asio::ip::tcp>_>
  handler;
  undefined1 local_1b8 [8];
  undefined1 auStack_1b0 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [23];
  
  local_220.h = (anon_class_8_1_8991fb9c *)&base[6].task_result_;
  local_220.v = (resolve_op<asio::ip::tcp,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]mau_MauProxy_cpp:532:13)>
                 *)base;
  local_220.p = (resolve_op<asio::ip::tcp,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]mau_MauProxy_cpp:532:13)>
                 *)base;
  if ((owner != (void *)0x0) && (base[6].func_ != (func_type)owner)) {
    std::__cxx11::string::string((string *)local_1b8,(string *)&base[3].task_result_);
    host = local_1b8;
    std::__cxx11::string::string((string *)&handler,(string *)(base + 5));
    socket_ops::background_getaddrinfo
              ((weak_cancel_token_type *)(base + 1),(char *)host,(char *)handler.handler_.this,
               (addrinfo_type *)&base[1].task_result_,(addrinfo_type **)&base[7].task_result_,
               (error_code *)(base + 7));
    std::__cxx11::string::~string((string *)&handler);
    std::__cxx11::string::~string((string *)local_1b8);
    scheduler::post_deferred_completion((scheduler *)base[6].func_,base);
    local_220.v = (resolve_op<asio::ip::tcp,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]mau_MauProxy_cpp:532:13)>
                   *)0x0;
    local_220.p = (resolve_op<asio::ip::tcp,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]mau_MauProxy_cpp:532:13)>
                   *)0x0;
    goto LAB_00109406;
  }
  this = &handler.arg2_;
  local_1b8 = (undefined1  [8])0x0;
  auStack_1b0 = (undefined1  [8])0x0;
  local_1a8[0]._M_allocated_capacity = 0;
  handler.handler_.this = *(ProxySession **)&base[6].task_result_;
  handler.arg1_._0_8_ = base[7].next_;
  handler.arg1_._M_cat = (error_category *)base[7].func_;
  ip::basic_resolver_iterator<asio::ip::tcp>::basic_resolver_iterator
            (&this->super_basic_resolver_iterator<asio::ip::tcp>,
             (basic_resolver_iterator<asio::ip::tcp> *)local_1b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)auStack_1b0);
  local_220.h = &handler.handler_;
  address_info = *(addrinfo_type **)&base[7].task_result_;
  if (address_info != (addrinfo_type *)0x0) {
    std::__cxx11::string::string((string *)local_1b8,(string *)&base[3].task_result_);
    std::__cxx11::string::string((string *)&addr,(string *)(base + 5));
    ip::basic_resolver_results<asio::ip::tcp>::create
              ((basic_resolver_results<asio::ip::tcp> *)&__begin1,address_info,(string *)local_1b8,
               (string *)&addr);
    ip::basic_resolver_iterator<asio::ip::tcp>::operator=
              (&this->super_basic_resolver_iterator<asio::ip::tcp>,&__begin1);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&__begin1.values_.
                super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__cxx11::string::~string((string *)&addr);
    std::__cxx11::string::~string((string *)local_1b8);
  }
  ptr::reset(&local_220);
  aVar3 = handler.handler_;
  if (owner != (void *)0x0) {
    ip::basic_resolver_results<asio::ip::tcp>::begin(&__begin1,this);
    __end1.index_ = 0;
    __end1.values_.
    super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    __end1.values_.
    super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    bVar4 = ip::operator!=(&__begin1,&__end1);
    if (bVar4) {
      pbVar2 = ((__begin1.values_.
                 super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->
               super__Vector_base<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (*(short *)&pbVar2[__begin1.index_].endpoint_.impl_.data_ == 2) {
        uVar5 = *(uint *)((long)&pbVar2[__begin1.index_].endpoint_.impl_.data_ + 4);
LAB_00109213:
        addr._0_8_ = (ulong)(uint)uVar5 << 0x20;
      }
      else {
        auStack_1b0 = *(undefined1 (*) [8])
                       ((long)&pbVar2[__begin1.index_].endpoint_.impl_.data_ + 8);
        local_1a8[0]._0_8_ =
             *(size_t *)((long)&pbVar2[__begin1.index_].endpoint_.impl_.data_ + 0x10);
        local_1a8[0]._8_8_ =
             ZEXT48(*(uint *)((long)&pbVar2[__begin1.index_].endpoint_.impl_.data_ + 0x18));
        local_1b8 = (undefined1  [8])0x1;
        bVar4 = ip::address::is_loopback((address *)local_1b8);
        if (!bVar4) {
          ip::address::to_v4((address *)&serverAddress);
          uVar5 = serverAddress.impl_.data_._0_4_;
          goto LAB_00109213;
        }
        addr.type_ = ipv4;
        addr.ipv4_address_.addr_.s_addr = (in4_addr_type)0x100007f;
      }
      addr.ipv6_address_.addr_.__in6_u._0_8_ = 0;
      addr.ipv6_address_.addr_.__in6_u._8_8_ = 0;
      addr.ipv6_address_.scope_id_ = 0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&__end1.values_.
                  super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&__begin1.values_.
                  super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
    }
    else {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&__end1.values_.
                  super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&__begin1.values_.
                  super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      addr.type_ = ipv4;
      addr.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
      addr.ipv6_address_.addr_.__in6_u._0_8_ = 0;
      addr.ipv6_address_.addr_.__in6_u._8_8_ = 0;
      addr.ipv6_address_.scope_id_ = 0;
    }
    bVar4 = ip::address::is_unspecified(&addr);
    if (bVar4) {
      if ((int)((aVar3.this)->super_DeliveryCommonData).Logger.ChannelMinLevel < 5) {
        local_1b8 = (undefined1  [8])((aVar3.this)->super_DeliveryCommonData).Logger.ChannelName;
        poVar1 = (ostringstream *)(auStack_1b0 + 8);
        auStack_1b0._0_4_ = 4;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,
                        (string *)&((aVar3.this)->super_DeliveryCommonData).Logger.Prefix);
        std::operator<<((ostream *)poVar1,"Unable to resolve server hostname: ");
        std::operator<<((ostream *)poVar1,(string *)&(aVar3.this)->ServerHostname);
        pOVar6 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar6,(LogStringBuffer *)local_1b8);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
      }
      LOCK();
      ((aVar3.this)->super_DeliveryCommonData).LastResult._M_i = Mau_HostnameLookup;
      UNLOCK();
    }
    else {
      ip::detail::endpoint::endpoint(&serverAddress.impl_,&addr,(aVar3.this)->ServerPort);
      mau::LockedValue<asio::ip::basic_endpoint<asio::ip::udp>_>::Set
                (&(aVar3.this)->ServerAddress,&serverAddress);
      mau::LockedValue<asio::ip::basic_endpoint<asio::ip::udp>_>::Set
                (&((aVar3.this)->C2S).DeliveryAddress,&serverAddress);
      if (serverAddress.impl_.data_.base.sa_family != 2) {
        __end1.values_.
        super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)serverAddress.impl_.data_.v4.sin_zero;
        __end1.index_ = serverAddress.impl_.data_._16_8_;
        serverAddress.impl_.data_.v6.sin6_flowinfo = 0;
      }
      else {
        __end1.values_.
        super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        __end1.index_ = 0;
      }
      __end1.values_.
      super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)
                CONCAT44(serverAddress.impl_.data_.v6.sin6_flowinfo,
                         (uint)(serverAddress.impl_.data_.base.sa_family != 2));
      ip::address::to_string_abi_cxx11_((string *)&__begin1,(address *)&__end1);
      if ((int)((aVar3.this)->super_DeliveryCommonData).Logger.ChannelMinLevel < 3) {
        local_1b8 = (undefined1  [8])((aVar3.this)->super_DeliveryCommonData).Logger.ChannelName;
        uVar7 = swap_bytes(serverAddress.impl_.data_.v4.sin_port);
        poVar1 = (ostringstream *)(auStack_1b0 + 8);
        auStack_1b0._0_4_ = 2;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,
                        (string *)&((aVar3.this)->super_DeliveryCommonData).Logger.Prefix);
        std::operator<<((ostream *)poVar1,"Resolved server address to ");
        std::operator<<((ostream *)poVar1,(string *)&__begin1);
        std::operator<<((ostream *)poVar1," : ");
        std::ostream::operator<<((ostream *)poVar1,uVar7);
        pOVar6 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar6,(LogStringBuffer *)local_1b8);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
      }
      std::__cxx11::string::~string((string *)&__begin1);
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&handler.arg2_.super_basic_resolver_iterator<asio::ip::tcp>.values_.
              super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
LAB_00109406:
  ptr::~ptr(&local_220);
  return;
}

Assistant:

static void do_complete(void* owner, operation* base,
      const asio::error_code& /*ec*/,
      std::size_t /*bytes_transferred*/)
  {
    // Take ownership of the operation object.
    resolve_op* o(static_cast<resolve_op*>(base));
    ptr p = { asio::detail::addressof(o->handler_), o, o };
    handler_work<Handler> w(o->handler_);

    if (owner && owner != &o->io_context_impl_)
    {
      // The operation is being run on the worker io_context. Time to perform
      // the resolver operation.
    
      // Perform the blocking host resolution operation.
      socket_ops::background_getaddrinfo(o->cancel_token_,
          o->query_.host_name().c_str(), o->query_.service_name().c_str(),
          o->query_.hints(), &o->addrinfo_, o->ec_);

      // Pass operation back to main io_context for completion.
      o->io_context_impl_.post_deferred_completion(o);
      p.v = p.p = 0;
    }
    else
    {
      // The operation has been returned to the main io_context. The completion
      // handler is ready to be delivered.

      ASIO_HANDLER_COMPLETION((*o));

      // Make a copy of the handler so that the memory can be deallocated
      // before the upcall is made. Even if we're not about to make an upcall,
      // a sub-object of the handler may be the true owner of the memory
      // associated with the handler. Consequently, a local copy of the handler
      // is required to ensure that any owning sub-object remains valid until
      // after we have deallocated the memory here.
      detail::binder2<Handler, asio::error_code, results_type>
        handler(o->handler_, o->ec_, results_type());
      p.h = asio::detail::addressof(handler.handler_);
      if (o->addrinfo_)
      {
        handler.arg2_ = results_type::create(o->addrinfo_,
            o->query_.host_name(), o->query_.service_name());
      }
      p.reset();

      if (owner)
      {
        fenced_block b(fenced_block::half);
        ASIO_HANDLER_INVOCATION_BEGIN((handler.arg1_, "..."));
        w.complete(handler, handler.handler_);
        ASIO_HANDLER_INVOCATION_END;
      }
    }
  }